

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

result_type __thiscall
Catch::uniform_integer_distribution<unsigned_long>::operator()
          (uniform_integer_distribution<unsigned_long> *this,SimplePcg32 *g)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  uint64_t uVar11;
  long lVar12;
  bool bVar13;
  
  uVar10 = this->m_ab_distance;
  uVar11 = g->m_state;
  if (uVar10 == 0) {
    lVar9 = 0x20;
    uVar10 = 0;
    do {
      uVar5 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
      bVar8 = (byte)(uVar11 >> 0x3b);
      uVar11 = uVar11 * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
      uVar10 = (ulong)(uVar5 >> bVar8 | uVar5 << 0x20 - bVar8) | uVar10 << 0x20;
      lVar9 = lVar9 + -0x20;
    } while (lVar9 == 0);
    g->m_state = uVar11;
  }
  else {
    lVar9 = 0x20;
    uVar6 = 0;
    do {
      uVar5 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
      bVar8 = (byte)(uVar11 >> 0x3b);
      uVar11 = uVar11 * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
      uVar6 = (ulong)(uVar5 >> bVar8 | uVar5 << 0x20 - bVar8) | uVar6 << 0x20;
      lVar9 = lVar9 + -0x20;
    } while (lVar9 == 0);
    g->m_state = uVar11;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    lVar9 = SUB168(auVar1 * auVar3,8);
    if (SUB168(auVar1 * auVar3,0) < this->m_rejection_threshold) {
      uVar6 = g->m_state;
      uVar7 = 0;
      lVar12 = 0;
      do {
        do {
          uVar5 = (uint)(uVar6 >> 0x2d) ^ (uint)(uVar6 >> 0x1b);
          bVar8 = (byte)(uVar6 >> 0x3b);
          uVar6 = uVar6 * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
          uVar7 = (ulong)(uVar5 >> bVar8 | uVar5 << 0x20 - bVar8) | uVar7 << 0x20;
          bVar13 = lVar12 == 0;
          lVar12 = lVar12 + 0x20;
        } while (bVar13);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar7;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar10;
        lVar9 = SUB168(auVar2 * auVar4,8);
        lVar12 = 0;
        uVar7 = 0;
      } while (SUB168(auVar2 * auVar4,0) < this->m_rejection_threshold);
      g->m_state = uVar6;
    }
    uVar10 = lVar9 + this->m_a;
  }
  return uVar10;
}

Assistant:

result_type operator()( Generator& g ) {
        // All possible values of result_type are valid.
        if ( m_ab_distance == 0 ) {
            return transposeBack( Detail::fillBitsFrom<UnsignedIntegerType>( g ) );
        }

        auto random_number = Detail::fillBitsFrom<UnsignedIntegerType>( g );
        auto emul = Detail::extendedMult( random_number, m_ab_distance );
        // Unlike Lemire's algorithm we skip the ab_distance check, since
        // we precomputed the rejection threshold, which is always tighter.
        while (emul.lower < m_rejection_threshold) {
            random_number = Detail::fillBitsFrom<UnsignedIntegerType>( g );
            emul = Detail::extendedMult( random_number, m_ab_distance );
        }

        return transposeBack(m_a + emul.upper);
    }